

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O1

void PrintHeader(int globalstrategy,int maxl,int maxlrst,sunrealtype fnormtol,sunrealtype scsteptol)

{
  puts("\nPredator-prey test problem --  KINSol (serial version)\n");
  printf("Mesh dimensions = %d X %d\n",8,8);
  printf("Number of species = %d\n",6);
  printf("Total system size = %d\n\n",0x180);
  printf("Flag globalstrategy = %d (0 = None, 1 = Linesearch)\n",0);
  printf("Linear solver is SPGMR with maxl = %d, maxlrst = %d\n",0xf,2);
  puts("Preconditioning uses interaction-only block-diagonal matrix");
  puts("Positivity constraints imposed on all components ");
  printf("Tolerance parameters:  fnormtol = %g   scsteptol = %g\n",0x3e7ad7f29abcaf48,
         0x3d3c25c268497682);
  puts("\nInitial profile of concentration");
  printf("At all mesh points:  %g %g %g   %g %g %g\n",0x3ff0000000000000,0x3ff0000000000000,0,
         0x40dd4c0000000000,0,0);
  return;
}

Assistant:

static void PrintHeader(int globalstrategy, int maxl, int maxlrst,
                        sunrealtype fnormtol, sunrealtype scsteptol)
{
  printf("\nPredator-prey test problem --  KINSol (serial version)\n\n");
  printf("Mesh dimensions = %d X %d\n", MX, MY);
  printf("Number of species = %d\n", NUM_SPECIES);
  printf("Total system size = %d\n\n", NEQ);
  printf("Flag globalstrategy = %d (0 = None, 1 = Linesearch)\n", globalstrategy);
  printf("Linear solver is SPGMR with maxl = %d, maxlrst = %d\n", maxl, maxlrst);
  printf("Preconditioning uses interaction-only block-diagonal matrix\n");
  printf("Positivity constraints imposed on all components \n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Tolerance parameters:  fnormtol = %Lg   scsteptol = %Lg\n", fnormtol,
         scsteptol);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Tolerance parameters:  fnormtol = %g   scsteptol = %g\n", fnormtol,
         scsteptol);
#else
  printf("Tolerance parameters:  fnormtol = %g   scsteptol = %g\n", fnormtol,
         scsteptol);
#endif

  printf("\nInitial profile of concentration\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("At all mesh points:  %Lg %Lg %Lg   %Lg %Lg %Lg\n", PREYIN, PREYIN,
         PREYIN, PREDIN, PREDIN, PREDIN);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("At all mesh points:  %g %g %g   %g %g %g\n", PREYIN, PREYIN, PREYIN,
         PREDIN, PREDIN, PREDIN);
#else
  printf("At all mesh points:  %g %g %g   %g %g %g\n", PREYIN, PREYIN, PREYIN,
         PREDIN, PREDIN, PREDIN);
#endif
}